

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

void __thiscall ncnn::Crop::Crop(Crop *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Crop_00621438;
  (this->axes).cstep = 0;
  (this->starts).data = (void *)0x0;
  (this->starts).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->starts).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->starts).elemsize + 4) = 0;
  (this->starts).allocator = (Allocator *)0x0;
  (this->starts).dims = 0;
  (this->starts).w = 0;
  (this->starts).w = 0;
  (this->starts).h = 0;
  (this->starts).d = 0;
  (this->starts).c = 0;
  (this->starts).cstep = 0;
  (this->ends).data = (void *)0x0;
  (this->ends).refcount = (int *)0x0;
  (this->ends).elemsize = 0;
  (this->ends).elempack = 0;
  (this->ends).allocator = (Allocator *)0x0;
  (this->ends).dims = 0;
  (this->ends).w = 0;
  (this->ends).w = 0;
  (this->ends).h = 0;
  (this->ends).d = 0;
  (this->ends).c = 0;
  (this->ends).cstep = 0;
  (this->axes).data = (void *)0x0;
  (this->axes).refcount = (int *)0x0;
  (this->axes).elemsize = 0;
  (this->axes).elempack = 0;
  (this->axes).allocator = (Allocator *)0x0;
  (this->axes).dims = 0;
  (this->axes).w = 0;
  (this->axes).w = 0;
  (this->axes).h = 0;
  (this->axes).d = 0;
  (this->axes).c = 0;
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = false;
  return;
}

Assistant:

Crop::Crop()
{
    one_blob_only = true;
    support_inplace = false;
}